

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.cc
# Opt level: O2

void __thiscall
Lists<std::shared_ptr<Array>_>::append(Lists<std::shared_ptr<Array>_> *this,shared_ptr<Array> *item)

{
  element_type *this_00;
  ListNodes<std::shared_ptr<Array>_> *this_01;
  shared_ptr<ListNodes<std::shared_ptr<Array>_>_> node;
  shared_ptr<ListNodes<std::shared_ptr<Array>_>_> local_58;
  __shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  node.super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  node.super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->theSize = this->theSize + 1;
  this_01 = (ListNodes<std::shared_ptr<Array>_> *)operator_new(0x20);
  std::__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&item->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>);
  local_58.super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_58.super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ListNodes<std::shared_ptr<Array>_>::ListNodes(this_01,(shared_ptr<Array> *)&local_40,&local_58);
  std::__shared_ptr<ListNodes<std::shared_ptr<Array>>,(__gnu_cxx::_Lock_policy)2>::
  reset<ListNodes<std::shared_ptr<Array>>>
            ((__shared_ptr<ListNodes<std::shared_ptr<Array>>,(__gnu_cxx::_Lock_policy)2> *)&node,
             this_01);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.
              super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  if ((this->theHead).
      super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2> *)this,
               &node.
                super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>);
  }
  else {
    this_00 = (this->theLast).
              super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    std::__shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,
               &node.
                super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2> *)
               this_00,&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  std::__shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->theLast).
              super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>,
             &node.
              super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&node.
              super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Lists<T>::append(T item) {
    shared_ptr<ListNodes<T>> node;

    theSize++;
    node.reset(new ListNodes<T>(item, 0));

    if (theHead == nullptr) {
        theHead = node;
        theLast = node;
    } else {
        theLast->set_next(node);
        theLast = node;
    }
}